

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O1

void __thiscall
robin_hood::detail::
Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<Rml::Variant_(const_std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>_&)>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::
Destroyer<robin_hood::detail::Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<Rml::Variant_(const_std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>_&)>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false>
::nodesDoNotDeallocate
          (Destroyer<robin_hood::detail::Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<Rml::Variant_(const_std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>_&)>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false>
           *this,Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<Rml::Variant_(const_std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>_&)>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *m)

{
  long lVar1;
  Node *pNVar2;
  code *pcVar3;
  long *plVar4;
  undefined1 auVar5 [16];
  long *plVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  
  m->mNumElements = 0;
  uVar7 = m->mMask + 1;
  if (uVar7 < 0x28f5c28f5c28f5d) {
    uVar8 = (uVar7 * 0x50) / 100;
  }
  else {
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar7 >> 2;
    uVar8 = (SUB168(auVar5 * ZEXT816(0x28f5c28f5c28f5c3),8) & 0x3ffffffffffffffc) * 0x14;
  }
  uVar10 = 0xff;
  if (uVar8 < 0xff) {
    uVar10 = uVar8;
  }
  if (uVar10 + uVar7 != 0) {
    lVar11 = 0x20;
    lVar9 = 0;
    do {
      if (m->mInfo[lVar9] != '\0') {
        pNVar2 = m->mKeyVals;
        pcVar3 = *(code **)((long)&(pNVar2->mData).first.field_2 + lVar11);
        if (pcVar3 != (code *)0x0) {
          lVar1 = (long)&(pNVar2->mData).first._M_dataplus._M_p + lVar11;
          (*pcVar3)(lVar1,lVar1,3);
        }
        plVar6 = (long *)((long)pNVar2 + lVar11 + -0x10);
        plVar4 = *(long **)((long)pNVar2 + lVar11 + -0x20);
        if (plVar6 != plVar4) {
          operator_delete(plVar4,*plVar6 + 1);
        }
      }
      lVar9 = lVar9 + 1;
      lVar11 = lVar11 + 0x40;
    } while (uVar10 + uVar7 != lVar9);
  }
  return;
}

Assistant:

void nodesDoNotDeallocate(M& m) const noexcept {
            m.mNumElements = 0;
            // clear also resets mInfo to 0, that's sometimes not necessary.
            auto const numElementsWithBuffer = m.calcNumElementsWithBuffer(m.mMask + 1);
            for (size_t idx = 0; idx < numElementsWithBuffer; ++idx) {
                if (0 != m.mInfo[idx]) {
                    Node& n = m.mKeyVals[idx];
                    n.destroyDoNotDeallocate();
                    n.~Node();
                }
            }
        }